

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomialfit.cpp
# Opt level: O0

fraction * __thiscall PolynomialFit::calcMatrixUnit(PolynomialFit *this,int x,int y)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  double n;
  fraction sum;
  undefined4 local_34;
  
  iVar1 = *(int *)(in_RDI + 0x14);
  for (local_34 = 0; (int)local_34 < *(int *)(in_RDI + 0x38); local_34 = local_34 + 1) {
    pow((double)*(longdouble *)(*(long *)(in_RDI + 0x20) + (long)(int)local_34 * 0x10),
        (double)((iVar1 * 2 - in_ESI) - in_EDX));
  }
  return (fraction *)(ulong)local_34;
}

Assistant:

fraction PolynomialFit::calcMatrixUnit(int x, int y)
{
    fraction sum = 0.0;
    double n = 2*degree - x - y  ;
    for(int i=0;i<count;i++)
    {
        sum += pow( (double)sx[i] , n ) * weight[i];
    }

    return sum;
}